

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O3

int __thiscall gmath::SturmChain<double>::countSignChangesPosInf(SturmChain<double> *this)

{
  double dVar1;
  Polynomial<double> *pPVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  iVar3 = 0;
  if (1 < (long)this->n) {
    pPVar2 = this->f;
    lVar4 = 0;
    iVar3 = 0;
    dVar5 = pPVar2->c[(long)pPVar2->used + -1];
    do {
      dVar1 = *(double *)
               (*(long *)((long)&pPVar2[1].c + lVar4) + -8 +
               (long)*(int *)((long)&pPVar2[1].used + lVar4) * 8);
      if (((dVar5 < 0.0) && (0.0 <= dVar1)) || ((0.0 <= dVar5 && (dVar1 < 0.0)))) {
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + 0x10;
      dVar5 = dVar1;
    } while ((long)this->n * 0x10 + -0x10 != lVar4);
  }
  return iVar3;
}

Assistant:

int countSignChangesPosInf() const
    {
      double f1;
      int    ret=0;

      // the sign of the highest coefficient has the same sign as the
      // limes at positive infinity

      f1=f[0][f[0].getDegree()];

      for (int k=1; k<n; k++)
      {
        double f2=f[k][f[k].getDegree()];

        if ((f1 < 0 && f2 >= 0) || (f1 >= 0 && f2 < 0))
        {
          ret++;
        }

        f1=f2;
      }

      return ret;
    }